

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O2

immutable_string __thiscall
ut::test_case_impl<agge::tests::VectorRasterizerTests>::fixture_name
          (test_case_impl<agge::tests::VectorRasterizerTests> *this)

{
  DeleterF extraout_RDX;
  immutable_string iVar1;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,"VectorRasterizerTests",&local_31);
  exportable::immutable_basic_string<char>::construct
            ((immutable_basic_string<char> *)this,&local_30);
  std::__cxx11::string::_M_dispose();
  iVar1._deleter = extraout_RDX;
  iVar1._text = (char *)this;
  return iVar1;
}

Assistant:

inline exportable::immutable_string test_case_impl<Fixture>::fixture_name() const
	{	return std::string(Fixture::__suite_name());	}